

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::anon_unknown_61::ValidatePipelineResourceSignatures
               (PipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  PipelineResourceLayoutDesc *LayoutDesc;
  ShaderResourceVariableDesc *Args_6;
  Uint32 UVar1;
  undefined4 uVar2;
  SHADER_TYPE SVar3;
  __buckets_ptr pp_Var4;
  _Hash_node_base *p_Var5;
  char *pcVar6;
  char *pcVar7;
  __node_base _Var8;
  __node_base _Var9;
  ShaderResourceVariableDesc *pSVar10;
  __node_type *p_Var11;
  __node_type *p_Var12;
  bool bVar13;
  bool bVar14;
  __hash_code _Var15;
  __hash_code _Var16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  undefined4 extraout_var;
  IPipelineResourceSignature **ppIVar21;
  char **Args_8;
  char **ppcVar22;
  undefined4 extraout_var_00;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> _Var23;
  _Hash_node_base *p_Var24;
  __node_base_ptr *__s;
  __node_base_ptr p_Var25;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> _Var26;
  char **ppcVar27;
  __node_base_ptr *__s_00;
  __node_base_ptr p_Var28;
  __node_type *p_Var29;
  __node_type *p_Var30;
  char (*in_RCX) [19];
  _Hash_node_base *p_Var31;
  __hash_code __code;
  __hash_code __code_00;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_type sVar35;
  ulong uVar36;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> it;
  _Hash_node_base _Var37;
  Char *pCVar38;
  _Hash_node_base _Var39;
  __node_type *p_Var40;
  __node_type *p_Var41;
  _Hash_node_base *p_Var42;
  Char **Args_6_00;
  __node_ptr __n;
  long lVar43;
  ImmutableSamplerDesc *pIVar44;
  __node_base *p_Var45;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  pVar46;
  undefined1 auVar47 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  pVar48;
  ShaderResourceVariableDesc SVar49;
  string msg_1;
  uint local_14c;
  char *local_148;
  char *local_140;
  __buckets_alloc_type __alloc;
  unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
  AllResources;
  unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
  AllImtblSamplers;
  array<const_Diligent::IPipelineResourceSignature_*,_8UL> ppSignatures;
  int *piVar20;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)&ppSignatures,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])0x6d38b1,in_RCX);
    DebugAssertionFailed
              ((Char *)ppSignatures._M_elems[0],"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xd3);
    std::__cxx11::string::~string((string *)&ppSignatures);
  }
  iVar18 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  piVar20 = (int *)CONCAT44(extraout_var,iVar18);
  bVar14 = true;
  if (((byte *)CreateInfo->pInternalData != (byte *)0x0) && ((*CreateInfo->pInternalData & 1) != 0))
  {
    if (CreateInfo->ResourceSignaturesCount == 1) {
      bVar14 = false;
    }
    else {
      ppSignatures._M_elems[0] =
           (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
      pp_Var4 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
      AllResources._M_h._M_buckets = (__buckets_ptr)0x6d490e;
      if (pp_Var4 != (__buckets_ptr)0x0) {
        AllResources._M_h._M_buckets = pp_Var4;
      }
      bVar14 = false;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[89],unsigned_int,char[13]>
                (false,"ValidatePipelineResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0xdd,(char (*) [16])"Description of ",(char **)&ppSignatures,
                 (char (*) [7])0x6f56ca,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                 (char (*) [89])
                 "When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount ("
                 ,&CreateInfo->ResourceSignaturesCount,(char (*) [13])") must be 1.");
    }
  }
  UVar1 = CreateInfo->ResourceSignaturesCount;
  ppIVar21 = CreateInfo->ppResourceSignatures;
  if (ppIVar21 == (IPipelineResourceSignature **)0x0 && UVar1 != 0) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var4 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x6d490e;
    if (pp_Var4 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var4;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[60],unsigned_int,char[15]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe0,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x6f56ca,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [60])"ppResourceSignatures is null, but ResourceSignaturesCount (",
               &CreateInfo->ResourceSignaturesCount,(char (*) [15])") is not zero.");
    ppIVar21 = CreateInfo->ppResourceSignatures;
    UVar1 = CreateInfo->ResourceSignaturesCount;
  }
  if ((ppIVar21 != (IPipelineResourceSignature **)0x0) && (UVar1 == 0)) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var4 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x6d490e;
    if (pp_Var4 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var4;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe3,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x6f56ca,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [71])
               "ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");
    ppIVar21 = CreateInfo->ppResourceSignatures;
  }
  if (ppIVar21 != (IPipelineResourceSignature **)0x0) {
    if ((CreateInfo->PSODesc).SRBAllocationGranularity != 1) {
      FormatString<char[135]>
                ((string *)&ppSignatures,
                 (char (*) [135])
                 "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,ppSignatures._M_elems[0],0,0);
      }
      std::__cxx11::string::~string((string *)&ppSignatures);
    }
    if (bVar14) {
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var4 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x6d490e;
        if (pp_Var4 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var4;
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[58],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf2,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x6f56ca,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [58])"The number of variables defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumVariables,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
      if ((CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var4 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x6d490e;
        if (pp_Var4 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var4;
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[67],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf8,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x6f56ca,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [67])
                   "The number of immutable samplers defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
    }
    AllResources._M_h._M_buckets = &AllResources._M_h._M_single_bucket;
    AllResources._M_h._M_bucket_count = 1;
    AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllResources._M_h._M_element_count = 0;
    AllResources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllResources._M_h._M_rehash_policy._M_next_resize = 0;
    AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
    AllImtblSamplers._M_h._M_buckets = &AllImtblSamplers._M_h._M_single_bucket;
    AllImtblSamplers._M_h._M_bucket_count = 1;
    AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllImtblSamplers._M_h._M_element_count = 0;
    AllImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
    AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ppSignatures._M_elems[6] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[7] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[4] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[5] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[2] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[3] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[0] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[1] = (IPipelineResourceSignature *)0x0;
    uVar19 = 0;
    while( true ) {
      p_Var45 = &AllResources._M_h._M_before_begin;
      local_148 = (char *)CONCAT44(local_148._4_4_,uVar19);
      if (CreateInfo->ResourceSignaturesCount <= uVar19) break;
      p_Var5 = (_Hash_node_base *)CreateInfo->ppResourceSignatures[uVar19];
      if (p_Var5 == (_Hash_node_base *)0x0) {
        msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        if (___alloc == (char *)0x0) {
          ___alloc = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[38],unsigned_int,char[9]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x111,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                   (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                   (char (*) [38])"Pipeline resource signature at index ",(uint *)&local_148,
                   (char (*) [9])0x70da73);
      }
      Args_8 = (char **)(*(code *)p_Var5->_M_nxt[4]._M_nxt)(p_Var5);
      bVar17 = *(byte *)((long)Args_8 + 0x24);
      if (7 < bVar17) {
        FormatString<char[127]>
                  (&msg_1,(char (*) [127])
                          "Resource signature binding index exceeds the limit. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                  );
        DebugAssertionFailed
                  (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x115);
        std::__cxx11::string::~string((string *)&msg_1);
        bVar17 = *(byte *)((long)Args_8 + 0x24);
      }
      uVar36 = (ulong)bVar17;
      if (ppSignatures._M_elems[uVar36] != (IPipelineResourceSignature *)0x0) {
        msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        if (___alloc == (char *)0x0) {
          ___alloc = "";
        }
        ppcVar22 = (char **)(*(code *)p_Var5->_M_nxt[4]._M_nxt)();
        local_140 = (char *)CONCAT44(local_140._4_4_,(uint)*(byte *)((long)Args_8 + 0x24));
        iVar18 = (*(ppSignatures._M_elems[*(byte *)((long)Args_8 + 0x24)]->super_IDeviceObject).
                   super_IObject._vptr_IObject[4])();
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x11b,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                   (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                   (char (*) [30])"Pipeline resource signature \'",ppcVar22,
                   (char (*) [20])"\' at binding index ",(uint *)&local_140,
                   (char (*) [45])" conflicts with another resource signature \'",
                   (char **)CONCAT44(extraout_var_00,iVar18),
                   (char (*) [28])"\' that uses the same index.");
        uVar36 = (ulong)*(byte *)((long)Args_8 + 0x24);
      }
      ppSignatures._M_elems[uVar36] = (IPipelineResourceSignature *)p_Var5;
      p_Var31 = p_Var5;
      for (uVar36 = 0; uVar36 < *(uint *)(Args_8 + 2); uVar36 = uVar36 + 1) {
        pcVar6 = Args_8[1];
        pcVar7 = *(char **)(pcVar6 + uVar36 * 0x18);
        if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
          FormatString<char[108]>
                    (&msg_1,(char (*) [108])
                            "Resource name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          p_Var31 = (_Hash_node_base *)0x122;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x122);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        p_Var42 = (_Hash_node_base *)(pcVar6 + uVar36 * 0x18);
        if (*(int *)&p_Var42[1]._M_nxt == 0) {
          FormatString<char[102]>
                    (&msg_1,(char (*) [102])
                            "Shader stages can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          p_Var31 = (_Hash_node_base *)0x123;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x123);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,(Char *)p_Var42->_M_nxt,false)
        ;
        pVar46 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                 ::equal_range(&AllResources,(key_type *)&msg_1);
        HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
        for (_Var23._M_cur =
                  (__node_type *)
                  pVar46.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>)
            _Var23._M_cur !=
            pVar46.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ; _Var23._M_cur = (__node_type *)((_Var23._M_cur)->super__Hash_node_base)._M_nxt) {
          if ((*(uint *)((long)&((_Var23._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                ._M_storage._M_storage + 0x10) & *(uint *)&p_Var42[1]._M_nxt) != 0)
          {
            if (*(_Hash_node_base **)
                 ((long)&((_Var23._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                         ._M_storage._M_storage + 0x18) == p_Var5) {
              FormatString<char[104]>
                        (&msg_1,(char (*) [104])
                                "Overlapping resources in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,299);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (___alloc == (char *)0x0) {
              ___alloc = "";
            }
            ppcVar22 = (char **)(**(code **)(**(long **)((long)&((_Var23._M_cur)->
                                                                                                                                
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
            p_Var31 = (_Hash_node_base *)0x12f;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[50],char_const*,char[8],char_const*,char[124]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x12f,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6f56ca,(char **)&__alloc,(char (*) [15])"\' is invalid: ",
                       (char (*) [18])"Shader resource \'",(char **)p_Var42,
                       (char (*) [50])"\' is found in more than one resource signature (\'",Args_8,
                       (char (*) [8])"\' and \'",ppcVar22,
                       (char (*) [124])
                       "\') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature."
                      );
          }
          if ((char)piVar20[3] == '\0') {
            if (*(int *)((long)&((_Var23._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                ._M_storage._M_storage + 0x10) == 0) {
              FormatString<char[26],char[39]>
                        (&msg_1,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"OtherRes.Stages != SHADER_TYPE_UNKNOWN",
                         (char (*) [39])p_Var31);
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x134);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            if (*(_Hash_node_base **)
                 ((long)&((_Var23._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                         ._M_storage._M_storage + 0x18) == p_Var5) {
              FormatString<char[111]>
                        (&msg_1,(char (*) [111])
                                "Resources with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x135);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (___alloc == (char *)0x0) {
              ___alloc = "";
            }
            ppcVar22 = (char **)(**(code **)(**(long **)((long)&((_Var23._M_cur)->
                                                                                                                                
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
            p_Var31 = (_Hash_node_base *)0x13a;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71],char_const*,char[50],char_const*,char[8],char_const*,char[206]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x13a,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6f56ca,(char **)&__alloc,(char (*) [15])"\' is invalid: ",
                       (char (*) [71])
                       "This device does not support separable programs, but shader resource \'",
                       (char **)p_Var42,
                       (char (*) [50])"\' is found in more than one resource signature (\'",Args_8,
                       (char (*) [8])"\' and \'",ppcVar22,
                       (char (*) [206])
                       "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single resource for all stages."
                      );
          }
        }
        uVar2 = *(undefined4 *)&p_Var42[1]._M_nxt;
        msg_1._M_dataplus._M_p = (pointer)&AllResources;
        p_Var24 = (_Hash_node_base *)::operator_new(0x30);
        p_Var24->_M_nxt = (_Hash_node_base *)0x0;
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)(p_Var24 + 1),(Char *)p_Var42->_M_nxt,false);
        *(undefined4 *)&p_Var24[3]._M_nxt = uVar2;
        p_Var24[4]._M_nxt = p_Var5;
        p_Var24[5]._M_nxt = p_Var42;
        p_Var31 = p_Var24[2]._M_nxt;
        __code = 1;
        msg_1._M_string_length = (size_type)p_Var24;
        auVar47 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&AllResources._M_h._M_rehash_policy,
                             AllResources._M_h._M_bucket_count,AllResources._M_h._M_element_count);
        sVar35 = auVar47._8_8_;
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (sVar35 == 1) {
            AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
            __s = &AllResources._M_h._M_single_bucket;
          }
          else {
            __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                            (&__alloc,sVar35);
            memset(__s,0,sVar35 * 8);
          }
          _Var8._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
          AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          bVar13 = false;
          _Var16 = 0;
          _Var39._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
          uVar34 = 0;
          while (_Var37._M_nxt = _Var8._M_nxt, __code = _Var16,
                _Var37._M_nxt != (_Hash_node_base *)0x0) {
            _Var8._M_nxt = (_Var37._M_nxt)->_M_nxt;
            uVar32 = ((ulong)_Var37._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
            if ((_Var39._M_nxt != (_Hash_node_base *)0x0) && (uVar34 == uVar32)) {
              (_Var37._M_nxt)->_M_nxt = (_Var39._M_nxt)->_M_nxt;
              bVar13 = true;
              goto LAB_005bafa8;
            }
            if (bVar13) {
              if ((_Var39._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                bVar13 = false;
                uVar33 = ((ulong)(_Var39._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
                if (uVar33 == uVar34) goto LAB_005baf5c;
                __s[uVar33] = _Var39._M_nxt;
              }
              bVar13 = false;
            }
LAB_005baf5c:
            if (__s[uVar32] != (_Hash_node_base *)0x0) {
              (_Var37._M_nxt)->_M_nxt = __s[uVar32]->_M_nxt;
              _Var39._M_nxt = __s[uVar32];
              goto LAB_005bafa8;
            }
            (_Var37._M_nxt)->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
            AllResources._M_h._M_before_begin._M_nxt = _Var37._M_nxt;
            __s[uVar32] = &AllResources._M_h._M_before_begin;
            _Var16 = uVar32;
            _Var39._M_nxt = _Var37._M_nxt;
            uVar34 = uVar32;
            if ((_Var37._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              _Var39._M_nxt = (_Hash_node_base *)(__s + __code);
              __code = uVar32;
LAB_005bafa8:
              *_Var39._M_nxt = (_Hash_node_base)_Var37._M_nxt;
              _Var16 = __code;
              _Var39._M_nxt = _Var37._M_nxt;
              uVar34 = uVar32;
            }
          }
          if ((bVar13) && ((_Var39._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) {
            __code = 0x7fffffffffffffff;
            uVar32 = ((ulong)(_Var39._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
            if (uVar32 != uVar34) {
              __s[uVar32] = _Var39._M_nxt;
            }
          }
          std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::_M_deallocate_buckets(&AllResources._M_h);
          AllResources._M_h._M_buckets = __s;
          AllResources._M_h._M_bucket_count = sVar35;
        }
        uVar34 = ((ulong)p_Var31 & 0x7fffffffffffffff) % AllResources._M_h._M_bucket_count;
        p_Var25 = std::
                  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  ::_M_find_before_node
                            (&AllResources._M_h,uVar34,(HashMapStringKey *)(p_Var24 + 1),__code);
        if (p_Var25 == (__node_base_ptr)0x0) {
          p_Var31 = (_Hash_node_base *)AllResources._M_h._M_buckets;
          if (AllResources._M_h._M_buckets[uVar34] == (__node_base_ptr)0x0) {
            p_Var24->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
            if (AllResources._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              AllResources._M_h._M_buckets
              [((ulong)AllResources._M_h._M_before_begin._M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
               AllResources._M_h._M_bucket_count] = p_Var24;
            }
            AllResources._M_h._M_buckets[uVar34] = &AllResources._M_h._M_before_begin;
            AllResources._M_h._M_before_begin._M_nxt = p_Var24;
          }
          else {
            p_Var24->_M_nxt = AllResources._M_h._M_buckets[uVar34]->_M_nxt;
            AllResources._M_h._M_buckets[uVar34]->_M_nxt = p_Var24;
          }
        }
        else {
          p_Var31 = p_Var25->_M_nxt;
          p_Var24->_M_nxt = p_Var31;
          p_Var25->_M_nxt = p_Var24;
        }
        AllResources._M_h._M_element_count = AllResources._M_h._M_element_count + 1;
        msg_1._M_string_length = 0;
        std::
        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
        ::_Scoped_node::~_Scoped_node((_Scoped_node *)&msg_1);
      }
      for (uVar36 = 0; uVar36 < *(uint *)(Args_8 + 4); uVar36 = uVar36 + 1) {
        pcVar6 = Args_8[3];
        lVar43 = uVar36 * 0x48;
        if ((*(char **)(pcVar6 + lVar43 + 8) == (char *)0x0) ||
           (**(char **)(pcVar6 + lVar43 + 8) == '\0')) {
          FormatString<char[107]>
                    (&msg_1,(char (*) [107])
                            "Sampler name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          p_Var31 = (_Hash_node_base *)0x143;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x143);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        p_Var42 = (_Hash_node_base *)(pcVar6 + lVar43);
        if (*(int *)&p_Var42->_M_nxt == 0) {
          FormatString<char[101]>
                    (&msg_1,(char (*) [101])
                            "Shader stage can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          p_Var31 = (_Hash_node_base *)0x144;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x144);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        ppcVar22 = (char **)(pcVar6 + lVar43 + 8);
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,*ppcVar22,false);
        pVar48 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                 ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
        HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
        for (_Var26._M_cur =
                  (__node_type *)
                  pVar48.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>)
            _Var26._M_cur !=
            pVar48.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
            ; _Var26._M_cur = (__node_type *)((_Var26._M_cur)->super__Hash_node_base)._M_nxt) {
          if ((*(uint *)((long)&((_Var26._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                ._M_storage._M_storage + 0x10) & *(uint *)&p_Var42->_M_nxt) != 0) {
            if (*(_Hash_node_base **)
                 ((long)&((_Var26._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                         ._M_storage._M_storage + 0x18) == p_Var5) {
              FormatString<char[113]>
                        (&msg_1,(char (*) [113])
                                "Overlapping immutable samplers in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x14c);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (___alloc == (char *)0x0) {
              ___alloc = "";
            }
            ppcVar27 = (char **)(**(code **)(**(long **)((long)&((_Var26._M_cur)->
                                                                                                                                
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
            p_Var31 = (_Hash_node_base *)0x150;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[50],char_const*,char[8],char_const*,char[119]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x150,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6f56ca,(char **)&__alloc,(char (*) [15])"\' is invalid: ",
                       (char (*) [20])"Immutable sampler \'",ppcVar22,
                       (char (*) [50])"\' is found in more than one resource signature (\'",Args_8,
                       (char (*) [8])"\' and \'",ppcVar27,
                       (char (*) [119])
                       "\') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature."
                      );
          }
          if ((char)piVar20[3] == '\0') {
            if (*(int *)((long)&((_Var26._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                ._M_storage._M_storage + 0x10) == 0) {
              FormatString<char[26],char[39]>
                        (&msg_1,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"OtherSam.Stages != SHADER_TYPE_UNKNOWN",
                         (char (*) [39])p_Var31);
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x155);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            if (*(_Hash_node_base **)
                 ((long)&((_Var26._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                         ._M_storage._M_storage + 0x18) == p_Var5) {
              FormatString<char[120]>
                        (&msg_1,(char (*) [120])
                                "Immutable samplers with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x156);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (___alloc == (char *)0x0) {
              ___alloc = "";
            }
            ppcVar27 = (char **)(**(code **)(**(long **)((long)&((_Var26._M_cur)->
                                                                                                                                
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
            p_Var31 = (_Hash_node_base *)0x15b;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[73],char_const*,char[50],char_const*,char[8],char_const*,char[215]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x15b,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x6f56ca,(char **)&__alloc,(char (*) [15])"\' is invalid: ",
                       (char (*) [73])
                       "This device does not support separable programs, but immutable sampler \'",
                       ppcVar22,(char (*) [50])"\' is found in more than one resource signature (\'"
                       ,Args_8,(char (*) [8])"\' and \'",ppcVar27,
                       (char (*) [215])
                       "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single immutable sampler for all stages."
                      );
          }
        }
        uVar2 = *(undefined4 *)&p_Var42->_M_nxt;
        msg_1._M_dataplus._M_p = (pointer)&AllImtblSamplers;
        p_Var24 = (_Hash_node_base *)::operator_new(0x30);
        p_Var24->_M_nxt = (_Hash_node_base *)0x0;
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)(p_Var24 + 1),*ppcVar22,false);
        *(undefined4 *)&p_Var24[3]._M_nxt = uVar2;
        p_Var24[4]._M_nxt = p_Var5;
        p_Var24[5]._M_nxt = p_Var42;
        p_Var31 = p_Var24[2]._M_nxt;
        __code_00 = 1;
        msg_1._M_string_length = (size_type)p_Var24;
        auVar47 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&AllImtblSamplers._M_h._M_rehash_policy,
                             AllImtblSamplers._M_h._M_bucket_count,
                             AllImtblSamplers._M_h._M_element_count);
        sVar35 = auVar47._8_8_;
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (sVar35 == 1) {
            AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
            __s_00 = &AllImtblSamplers._M_h._M_single_bucket;
          }
          else {
            __s_00 = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                     allocate(&__alloc,sVar35);
            memset(__s_00,0,sVar35 * 8);
          }
          _Var9._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
          AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          bVar13 = false;
          _Var15 = 0;
          _Var39._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
          uVar34 = 0;
          while (_Var37._M_nxt = _Var9._M_nxt, __code_00 = _Var15,
                _Var37._M_nxt != (_Hash_node_base *)0x0) {
            _Var9._M_nxt = (_Var37._M_nxt)->_M_nxt;
            uVar32 = ((ulong)_Var37._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
            if ((_Var39._M_nxt != (_Hash_node_base *)0x0) && (uVar34 == uVar32)) {
              (_Var37._M_nxt)->_M_nxt = (_Var39._M_nxt)->_M_nxt;
              bVar13 = true;
              goto LAB_005bb572;
            }
            if (bVar13) {
              if ((_Var39._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                bVar13 = false;
                uVar33 = ((ulong)(_Var39._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
                if (uVar33 == uVar34) goto LAB_005bb51d;
                __s_00[uVar33] = _Var39._M_nxt;
              }
              bVar13 = false;
            }
LAB_005bb51d:
            if (__s_00[uVar32] != (_Hash_node_base *)0x0) {
              (_Var37._M_nxt)->_M_nxt = __s_00[uVar32]->_M_nxt;
              _Var39._M_nxt = __s_00[uVar32];
              goto LAB_005bb572;
            }
            (_Var37._M_nxt)->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
            AllImtblSamplers._M_h._M_before_begin._M_nxt = _Var37._M_nxt;
            __s_00[uVar32] = &AllImtblSamplers._M_h._M_before_begin;
            _Var15 = uVar32;
            _Var39._M_nxt = _Var37._M_nxt;
            uVar34 = uVar32;
            if ((_Var37._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              _Var39._M_nxt = (_Hash_node_base *)(__s_00 + __code_00);
              __code_00 = uVar32;
LAB_005bb572:
              *_Var39._M_nxt = (_Hash_node_base)_Var37._M_nxt;
              _Var15 = __code_00;
              _Var39._M_nxt = _Var37._M_nxt;
              uVar34 = uVar32;
            }
          }
          if ((bVar13) && ((_Var39._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) {
            __code_00 = 0x7fffffffffffffff;
            uVar32 = ((ulong)(_Var39._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar35;
            if (uVar32 != uVar34) {
              __s_00[uVar32] = _Var39._M_nxt;
            }
          }
          std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::_M_deallocate_buckets(&AllImtblSamplers._M_h);
          AllImtblSamplers._M_h._M_buckets = __s_00;
          AllImtblSamplers._M_h._M_bucket_count = sVar35;
        }
        uVar34 = ((ulong)p_Var31 & 0x7fffffffffffffff) % AllImtblSamplers._M_h._M_bucket_count;
        p_Var28 = std::
                  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  ::_M_find_before_node
                            (&AllImtblSamplers._M_h,uVar34,(HashMapStringKey *)(p_Var24 + 1),
                             __code_00);
        if (p_Var28 == (__node_base_ptr)0x0) {
          p_Var31 = (_Hash_node_base *)AllImtblSamplers._M_h._M_buckets;
          if (AllImtblSamplers._M_h._M_buckets[uVar34] == (__node_base_ptr)0x0) {
            p_Var24->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
            if (AllImtblSamplers._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              AllImtblSamplers._M_h._M_buckets
              [((ulong)AllImtblSamplers._M_h._M_before_begin._M_nxt[2]._M_nxt & 0x7fffffffffffffff)
               % AllImtblSamplers._M_h._M_bucket_count] = p_Var24;
            }
            AllImtblSamplers._M_h._M_buckets[uVar34] = &AllImtblSamplers._M_h._M_before_begin;
            AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var24;
          }
          else {
            p_Var24->_M_nxt = AllImtblSamplers._M_h._M_buckets[uVar34]->_M_nxt;
            AllImtblSamplers._M_h._M_buckets[uVar34]->_M_nxt = p_Var24;
          }
        }
        else {
          p_Var31 = p_Var28->_M_nxt;
          p_Var24->_M_nxt = p_Var31;
          p_Var28->_M_nxt = p_Var24;
        }
        AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count + 1;
        msg_1._M_string_length = 0;
        std::
        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
        ::_Scoped_node::~_Scoped_node((_Scoped_node *)&msg_1);
      }
      uVar19 = (int)local_148 + 1;
    }
    if ((!bVar14) && (1 < *piVar20 - 3U)) {
      LayoutDesc = &(CreateInfo->PSODesc).ResourceLayout;
      for (local_14c = 0; local_14c < (CreateInfo->PSODesc).ResourceLayout.NumVariables;
          local_14c = local_14c + 1) {
        pSVar10 = (CreateInfo->PSODesc).ResourceLayout.Variables;
        Args_6 = pSVar10 + local_14c;
        pCVar38 = pSVar10[local_14c].Name;
        if (pCVar38 == (Char *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (___alloc == (char *)0x0) {
            ___alloc = "";
          }
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[15]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x16c,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                     (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                     (char (*) [26])"ResourceLayout.Variables[",&local_14c,
                     (char (*) [15])"].Name is null");
          pCVar38 = Args_6->Name;
        }
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,pCVar38,false);
        pVar46 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                 ::equal_range(&AllResources,(key_type *)&msg_1);
        _Var23._M_cur =
             (__node_type *)
             pVar46.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
             ._M_cur;
        HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
        while( true ) {
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              )_Var23._M_cur ==
              pVar46.second.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
             ) goto LAB_005bba29;
          SVar3 = *(SHADER_TYPE *)
                   ((long)&((_Var23._M_cur)->
                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                           ._M_storage._M_storage + 0x10);
          if ((Args_6->ShaderStages & SVar3) != SHADER_TYPE_UNKNOWN) break;
          _Var23._M_cur = (__node_type *)((_Var23._M_cur)->super__Hash_node_base)._M_nxt;
        }
        if (SVar3 != Args_6->ShaderStages) {
          local_148 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          local_140 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (local_140 == (char *)0x0) {
            local_140 = "";
          }
          GetShaderStagesString_abi_cxx11_
                    (&msg_1,(Diligent *)(ulong)Args_6->ShaderStages,ShaderStages);
          GetShaderStagesString_abi_cxx11_
                    ((String *)&__alloc,
                     (Diligent *)
                     (ulong)*(uint *)((long)&((_Var23._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_00);
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x17a,(char (*) [16])"Description of ",&local_148,(char (*) [7])0x6f56ca,
                     &local_140,(char (*) [15])"\' is invalid: ",
                     (char (*) [28])"Shader stages of variable \'",&Args_6->Name,
                     (char (*) [35])"\' defined by the resource layout (",&msg_1,
                     (char (*) [71])
                     ") do not match the stages defined by the implicit resource signature (",
                     (String *)&__alloc,
                     (char (*) [73])
                     "). This might indicate a bug in the serialization/deserialization logic.");
          std::__cxx11::string::~string((string *)&__alloc);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        if (*(SHADER_RESOURCE_VARIABLE_TYPE *)
             (*(long *)((long)&((_Var23._M_cur)->
                               super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                               ._M_storage._M_storage + 0x20) + 0x11) != Args_6->Type) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (___alloc == (char *)0x0) {
            ___alloc = "";
          }
          local_148 = GetShaderVariableTypeLiteralName(Args_6->Type,false);
          local_140 = GetShaderVariableTypeLiteralName
                                (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                                  (*(long *)((long)&((_Var23._M_cur)->
                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x20) + 0x11),false);
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x181,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                     (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                     (char (*) [23])"The type of variable \'",&Args_6->Name,
                     (char (*) [35])"\' defined by the resource layout (",&local_148,
                     (char (*) [71])
                     ") does not match the type defined by the implicit resource signature (",
                     &local_140,
                     (char (*) [73])
                     "). This might indicate a bug in the serialization/deserialization logic.");
        }
        uVar36 = (*(ulong *)((long)&((_Var23._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                    ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                 AllResources._M_h._M_bucket_count;
        p_Var40 = (__node_type *)AllResources._M_h._M_buckets[uVar36];
        p_Var11 = p_Var40;
        do {
          p_Var29 = p_Var11;
          p_Var11 = (__node_type *)(p_Var29->super__Hash_node_base)._M_nxt;
        } while (p_Var11 != _Var23._M_cur);
        p_Var5 = ((_Var23._M_cur)->super__Hash_node_base)._M_nxt;
        if (p_Var40 == p_Var29) {
          if (p_Var5 != (_Hash_node_base *)0x0) {
            uVar34 = ((ulong)p_Var5[2]._M_nxt & 0x7fffffffffffffff) %
                     AllResources._M_h._M_bucket_count;
            if (uVar34 == uVar36) goto LAB_005bba12;
            AllResources._M_h._M_buckets[uVar34] = (__node_base_ptr)p_Var40;
            p_Var40 = (__node_type *)AllResources._M_h._M_buckets[uVar36];
          }
          if ((__node_type *)p_Var45 == p_Var40) {
            AllResources._M_h._M_before_begin._M_nxt = p_Var5;
          }
          AllResources._M_h._M_buckets[uVar36] = (__node_base_ptr)0x0;
        }
        else if ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar34 = ((ulong)p_Var5[2]._M_nxt & 0x7fffffffffffffff) %
                          AllResources._M_h._M_bucket_count, uVar34 != uVar36)) {
          AllResources._M_h._M_buckets[uVar34] = &p_Var29->super__Hash_node_base;
        }
LAB_005bba12:
        (p_Var29->super__Hash_node_base)._M_nxt = ((_Var23._M_cur)->super__Hash_node_base)._M_nxt;
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
        ::_M_deallocate_node
                  ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                    *)_Var23._M_cur,(__node_ptr)AllResources._M_h._M_buckets);
        AllResources._M_h._M_element_count = AllResources._M_h._M_element_count - 1;
LAB_005bba29:
      }
      while (p_Var45 = p_Var45->_M_nxt, p_Var45 != (__node_base *)0x0) {
        p_Var5 = p_Var45[5]._M_nxt;
        if ((*(undefined1 *)((long)&p_Var5[2]._M_nxt + 1) != LayoutDesc->DefaultVariableType) &&
           (((*(char *)&p_Var5[2]._M_nxt != '\x06' ||
             (lVar43 = (*(code *)(p_Var45[4]._M_nxt)->_M_nxt[4]._M_nxt)(),
             *(char *)(lVar43 + 0x25) != '\x01')) ||
            (SVar49 = FindPipelineResourceLayoutVariable
                                (LayoutDesc,(char *)p_Var5->_M_nxt,*(SHADER_TYPE *)&p_Var5[1]._M_nxt
                                 ,*(char **)(lVar43 + 0x28)),
            *(undefined1 *)((long)&p_Var5[2]._M_nxt + 1) != SVar49.Type)))) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (___alloc == (char *)0x0) {
            ___alloc = "";
          }
          local_148 = GetShaderVariableTypeLiteralName
                                (*(undefined1 *)((long)&p_Var5[2]._M_nxt + 1),false);
          local_140 = GetShaderVariableTypeLiteralName(LayoutDesc->DefaultVariableType,false);
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[50],char_const*,char[45],char_const*,char[73]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1a4,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                     (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                     (char (*) [23])"The type of variable \'",(char **)p_Var5,
                     (char (*) [50])"\' not explicitly defined by the resource layout (",&local_148,
                     (char (*) [45])") does not match the default variable type (",&local_140,
                     (char (*) [73])
                     "). This might indicate a bug in the serialization/deserialization logic.");
        }
      }
      uVar19 = 0;
      while (local_14c = uVar19, uVar19 < (CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers)
      {
        pIVar44 = (CreateInfo->PSODesc).ResourceLayout.ImmutableSamplers;
        Args_6_00 = &pIVar44[uVar19].SamplerOrTextureName;
        pCVar38 = *Args_6_00;
        if (pCVar38 == (Char *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (___alloc == (char *)0x0) {
            ___alloc = "";
          }
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1ac,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                     (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                     (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_14c,
                     (char (*) [31])"].SamplerOrTextureName is null");
          pCVar38 = *Args_6_00;
        }
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,pCVar38,false);
        pIVar44 = pIVar44 + uVar19;
        pVar48 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                 ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
        HashMapStringKey::Clear((HashMapStringKey *)&msg_1);
        for (_Var26._M_cur =
                  (__node_type *)
                  pVar48.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>)
            _Var26._M_cur !=
            pVar48.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
            ; _Var26._M_cur = (__node_type *)((_Var26._M_cur)->super__Hash_node_base)._M_nxt) {
          SVar3 = *(SHADER_TYPE *)
                   ((long)&((_Var26._M_cur)->
                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                           ._M_storage._M_storage + 0x10);
          if ((pIVar44->ShaderStages & SVar3) != SHADER_TYPE_UNKNOWN) {
            if (SVar3 != pIVar44->ShaderStages) {
              local_148 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
              local_140 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
              if (local_140 == (char *)0x0) {
                local_140 = "";
              }
              GetShaderStagesString_abi_cxx11_
                        (&msg_1,(Diligent *)(ulong)pIVar44->ShaderStages,ShaderStages_01);
              GetShaderStagesString_abi_cxx11_
                        ((String *)&__alloc,(Diligent *)(ulong)pIVar44->ShaderStages,ShaderStages_02
                        );
              LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[37],char_const*,char[35],std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
                        (false,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x1b9,(char (*) [16])"Description of ",&local_148,(char (*) [7])0x6f56ca,
                         &local_140,(char (*) [15])"\' is invalid: ",
                         (char (*) [37])"Shader stages of immutable sampler \'",Args_6_00,
                         (char (*) [35])"\' defined by the resource layout (",&msg_1,
                         (char (*) [70])
                         ") do not match the stages defined by the implicit resource signatre (",
                         (String *)&__alloc,
                         (char (*) [73])
                         "). This might indicate a bug in the serialization/deserialization logic.")
              ;
              std::__cxx11::string::~string((string *)&__alloc);
              std::__cxx11::string::~string((string *)&msg_1);
            }
            goto LAB_005bbd82;
          }
        }
        msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        ___alloc = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        if (___alloc == (char *)0x0) {
          ___alloc = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[45],char_const*,char[58],char[70]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1c1,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                   (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                   (char (*) [45])"Resource layout contains immutable sampler \'",Args_6_00,
                   (char (*) [58])"\' that is not present in the implicit resource signatre. ",
                   (char (*) [70])0x7eeefa);
LAB_005bbd82:
        uVar36 = (*(ulong *)((long)&((_Var26._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                    ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                 AllImtblSamplers._M_h._M_bucket_count;
        p_Var41 = (__node_type *)AllImtblSamplers._M_h._M_buckets[uVar36];
        p_Var12 = p_Var41;
        do {
          p_Var30 = p_Var12;
          p_Var12 = (__node_type *)(p_Var30->super__Hash_node_base)._M_nxt;
        } while (p_Var12 != _Var26._M_cur);
        p_Var5 = ((_Var26._M_cur)->super__Hash_node_base)._M_nxt;
        if (p_Var41 == p_Var30) {
          if (p_Var5 != (_Hash_node_base *)0x0) {
            uVar34 = ((ulong)p_Var5[2]._M_nxt & 0x7fffffffffffffff) %
                     AllImtblSamplers._M_h._M_bucket_count;
            if (uVar34 == uVar36) goto LAB_005bbe36;
            AllImtblSamplers._M_h._M_buckets[uVar34] = (__node_base_ptr)p_Var41;
            p_Var41 = (__node_type *)AllImtblSamplers._M_h._M_buckets[uVar36];
          }
          if ((__node_type *)&AllImtblSamplers._M_h._M_before_begin == p_Var41) {
            AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var5;
          }
          AllImtblSamplers._M_h._M_buckets[uVar36] = (__node_base_ptr)0x0;
        }
        else if ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar34 = ((ulong)p_Var5[2]._M_nxt & 0x7fffffffffffffff) %
                          AllImtblSamplers._M_h._M_bucket_count, uVar34 != uVar36)) {
          AllImtblSamplers._M_h._M_buckets[uVar34] = &p_Var30->super__Hash_node_base;
        }
LAB_005bbe36:
        (p_Var30->super__Hash_node_base)._M_nxt = ((_Var26._M_cur)->super__Hash_node_base)._M_nxt;
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
        ::_M_deallocate_node
                  ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                    *)_Var26._M_cur,(__node_ptr)AllImtblSamplers._M_h._M_buckets);
        AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count - 1;
        uVar19 = local_14c + 1;
      }
      if (AllImtblSamplers._M_h._M_element_count != 0) {
        p_Var5 = AllImtblSamplers._M_h._M_before_begin._M_nxt[5]._M_nxt;
        msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        pcVar6 = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        ___alloc = "";
        if (pcVar6 != (char *)0x0) {
          ___alloc = pcVar6;
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57],char_const*,char[47],char[70]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1ca,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x6f56ca,
                   (char **)&__alloc,(char (*) [15])"\' is invalid: ",
                   (char (*) [57])"Implicit resource signature contains immutable sampler \'",
                   (char **)(p_Var5 + 1),
                   (char (*) [47])"\' that is not present in the resource layout. ",
                   (char (*) [70])0x7eeefa);
      }
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
    ::~unordered_multimap(&AllImtblSamplers);
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
    ::~unordered_multimap(&AllResources);
  }
  return;
}

Assistant:

void ValidatePipelineResourceSignatures(const PipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*           pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RenderDeviceInfo& DeviceInfo = pDevice->GetDeviceInfo();
    const DeviceFeatures&   Features   = DeviceInfo.Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;

    const PSOCreateInternalInfo*    pInternalCI   = static_cast<const PSOCreateInternalInfo*>(CreateInfo.pInternalData);
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = pInternalCI != nullptr ? pInternalCI->Flags : PSO_CREATE_INTERNAL_FLAG_NONE;

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 && CreateInfo.ResourceSignaturesCount != 1)
        LOG_PSO_ERROR_AND_THROW("When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") must be 1.");

    if (CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures == nullptr)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is null, but ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") is not zero.");

    if (CreateInfo.ppResourceSignatures != nullptr && CreateInfo.ResourceSignaturesCount == 0)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");

    if (CreateInfo.ppResourceSignatures == nullptr)
        return;

    if (CreateInfo.PSODesc.SRBAllocationGranularity != 1)
    {
        LOG_WARNING_MESSAGE("PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning.");
    }

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        if (CreateInfo.PSODesc.ResourceLayout.NumVariables != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of variables defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumVariables,
                                    ") must be zero when resource signatures are used.");
        }

        if (CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of immutable samplers defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers,
                                    ") must be zero when resource signatures are used.");
        }
    }

    struct ResourceInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const PipelineResourceDesc&       Desc;
    };
    struct ImtblSamInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const ImmutableSamplerDesc&       Desc;
    };

    std::unordered_multimap<HashMapStringKey, ResourceInfo> AllResources;
    std::unordered_multimap<HashMapStringKey, ImtblSamInfo> AllImtblSamplers;

    std::array<const IPipelineResourceSignature*, MAX_RESOURCE_SIGNATURES> ppSignatures = {};
    for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
    {
        const IPipelineResourceSignature* const pSignature = CreateInfo.ppResourceSignatures[i];
        if (pSignature == nullptr)
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature at index ", i, " is null");

        const PipelineResourceSignatureDesc& SignDesc = pSignature->GetDesc();
        VERIFY(SignDesc.BindingIndex < MAX_RESOURCE_SIGNATURES,
               "Resource signature binding index exceeds the limit. This error should've been caught by ValidatePipelineResourceSignatureDesc.");

        if (ppSignatures[SignDesc.BindingIndex] != nullptr)
        {
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature '", pSignature->GetDesc().Name, "' at binding index ", Uint32{SignDesc.BindingIndex},
                                    " conflicts with another resource signature '", ppSignatures[SignDesc.BindingIndex]->GetDesc().Name,
                                    "' that uses the same index.");
        }
        ppSignatures[SignDesc.BindingIndex] = pSignature;

        for (Uint32 res = 0; res < SignDesc.NumResources; ++res)
        {
            const PipelineResourceDesc& ResDesc = SignDesc.Resources[res];
            VERIFY(ResDesc.Name != nullptr && ResDesc.Name[0] != '\0', "Resource name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(ResDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stages can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllResources.equal_range(ResDesc.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ResourceInfo& OtherRes = it->second;
                if ((OtherRes.Stages & ResDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherRes.pSign != pSignature, "Overlapping resources in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Shader resource '", ResDesc.Name, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherRes.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherRes.pSign != pSignature, "Resources with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but shader resource '", ResDesc.Name, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            AllResources.emplace(ResDesc.Name, ResourceInfo{ResDesc.ShaderStages, pSignature, ResDesc});
        }

        for (Uint32 res = 0; res < SignDesc.NumImmutableSamplers; ++res)
        {
            const ImmutableSamplerDesc& SamDesc = SignDesc.ImmutableSamplers[res];
            VERIFY(SamDesc.SamplerOrTextureName != nullptr && SamDesc.SamplerOrTextureName[0] != '\0', "Sampler name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(SamDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stage can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ImtblSamInfo& OtherSam = it->second;
                if ((OtherSam.Stages & SamDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherSam.pSign != pSignature, "Overlapping immutable samplers in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherSam.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherSam.pSign != pSignature, "Immutable samplers with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single immutable sampler for all stages.");
                }
            }
            AllImtblSamplers.emplace(SamDesc.SamplerOrTextureName, ImtblSamInfo{SamDesc.ShaderStages, pSignature, SamDesc});
        }
    }


    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 &&
        // Deserialized default signatures are empty in OpenGL.
        !DeviceInfo.IsGLDevice())
    {
        const PipelineResourceLayoutDesc& ResLayout = CreateInfo.PSODesc.ResourceLayout;
        for (Uint32 i = 0; i < ResLayout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = ResLayout.Variables[i];
            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name is null");

            auto range = AllResources.equal_range(Var.Name);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ResourceInfo& SignRes = it->second;
                if ((SignRes.Stages & Var.ShaderStages) == 0)
                    continue;

                if (SignRes.Stages != Var.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of variable '", Var.Name, "' defined by the resource layout (", GetShaderStagesString(Var.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signature (", GetShaderStagesString(SignRes.Stages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                if (SignRes.Desc.VarType != Var.Type)
                {
                    LOG_PSO_ERROR_AND_THROW("The type of variable '", Var.Name, "' defined by the resource layout (", GetShaderVariableTypeLiteralName(Var.Type),
                                            ") does not match the type defined by the implicit resource signature (", GetShaderVariableTypeLiteralName(SignRes.Desc.VarType),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }

            if (it == range.second)
            {
                // It is OK - there may be variables in the resource layout
                // that don't present in any shader.
            }
            else
            {
                AllResources.erase(it);
            }
        }
        for (const auto& it : AllResources)
        {
            const PipelineResourceDesc& ResDesc = it.second.Desc;

            bool VarTypeOK = ResDesc.VarType == ResLayout.DefaultVariableType;
            if (!VarTypeOK && ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
            {
                const PipelineResourceSignatureDesc& SignDesc = it.second.pSign->GetDesc();
                if (SignDesc.UseCombinedTextureSamplers)
                {
                    const ShaderResourceVariableDesc RefDesc = FindPipelineResourceLayoutVariable(PSODesc.ResourceLayout, ResDesc.Name, ResDesc.ShaderStages, SignDesc.CombinedSamplerSuffix);
                    // The type of the immutable sampler must match the type of the texture variable it is assigned to
                    VarTypeOK = RefDesc.Type == ResDesc.VarType;
                }
            }
            if (!VarTypeOK)
            {
                LOG_PSO_ERROR_AND_THROW("The type of variable '", ResDesc.Name, "' not explicitly defined by the resource layout (", GetShaderVariableTypeLiteralName(ResDesc.VarType),
                                        ") does not match the default variable type (", GetShaderVariableTypeLiteralName(ResLayout.DefaultVariableType),
                                        "). This might indicate a bug in the serialization/deserialization logic.");
            }
        }

        for (Uint32 i = 0; i < ResLayout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& ImtblSam = ResLayout.ImmutableSamplers[i];
            if (ImtblSam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName is null");
            auto range = AllImtblSamplers.equal_range(ImtblSam.SamplerOrTextureName);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ImtblSamInfo& SignSam = it->second;
                if ((SignSam.Stages & ImtblSam.ShaderStages) == 0)
                    continue;

                if (SignSam.Stages != ImtblSam.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of immutable sampler '", ImtblSam.SamplerOrTextureName, "' defined by the resource layout (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signatre (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }
            if (it == range.second)
            {
                LOG_PSO_ERROR_AND_THROW("Resource layout contains immutable sampler '", ImtblSam.SamplerOrTextureName, "' that is not present in the implicit resource signatre. ",
                                        "This might indicate a bug in the serialization/deserialization logic.");
            }

            AllImtblSamplers.erase(it);
        }
        if (!AllImtblSamplers.empty())
        {
            const ImmutableSamplerDesc& SamDesc = AllImtblSamplers.begin()->second.Desc;
            LOG_PSO_ERROR_AND_THROW("Implicit resource signature contains immutable sampler '", SamDesc.SamplerOrTextureName, "' that is not present in the resource layout. ",
                                    "This might indicate a bug in the serialization/deserialization logic.");
        }
    }
}